

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IM_Command.h
# Opt level: O3

shared_ptr<nigel::IM_Constant>
nigel::IM_Constant::fromAstLiteral(shared_ptr<nigel::AstLiteral> *ast)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  shared_ptr<nigel::IM_Constant> sVar2;
  undefined1 local_21;
  _func_int **local_20;
  element_type *local_18;
  
  Token::as<nigel::Token_NumberL>((Token *)&stack0xffffffffffffffe0);
  std::__shared_ptr<nigel::IM_Constant,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<nigel::IM_Constant>,int_const&>
            ((__shared_ptr<nigel::IM_Constant,(__gnu_cxx::_Lock_policy)2> *)ast,
             (allocator<nigel::IM_Constant> *)&local_21,(int *)(local_20 + 10));
  _Var1._M_pi = extraout_RDX;
  if (local_18 != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_18);
    _Var1._M_pi = extraout_RDX_00;
  }
  sVar2.super___shared_ptr<nigel::IM_Constant,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var1._M_pi;
  sVar2.super___shared_ptr<nigel::IM_Constant,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)ast;
  return (shared_ptr<nigel::IM_Constant>)
         sVar2.super___shared_ptr<nigel::IM_Constant,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static std::shared_ptr<IM_Constant> fromAstLiteral( std::shared_ptr<AstLiteral> ast )
		{
			return std::make_shared<IM_Constant>( ast->token->as<Token_NumberL>()->number );
		}